

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  int iVar1;
  SrcList *pSVar2;
  RenameCtx *pRVar3;
  char *pcVar4;
  long lVar5;
  RenameToken *pToken;
  RenameToken *pRVar6;
  RenameToken *pRVar7;
  RenameToken **ppRVar8;
  
  pSVar2 = pSelect->pSrc;
  iVar1 = pSVar2->nSrc;
  if (0 < (long)iVar1) {
    pRVar3 = (pWalker->u).pRename;
    lVar5 = 0;
    do {
      if (pSVar2->a[lVar5].pTab == pRVar3->pTab) {
        pRVar7 = pWalker->pParse->pRename;
        if (pRVar7 != (RenameToken *)0x0) {
          pcVar4 = pSVar2->a[lVar5].zName;
          if ((char *)pRVar7->p == pcVar4) {
            ppRVar8 = &pWalker->pParse->pRename;
          }
          else {
            do {
              pRVar6 = pRVar7;
              pRVar7 = pRVar6->pNext;
              if (pRVar7 == (RenameToken *)0x0) goto LAB_00191321;
            } while ((char *)pRVar7->p != pcVar4);
            ppRVar8 = &pRVar6->pNext;
          }
          *ppRVar8 = pRVar7->pNext;
          pRVar7->pNext = pRVar3->pList;
          pRVar3->pList = pRVar7;
          pRVar3->nList = pRVar3->nList + 1;
        }
      }
LAB_00191321:
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return 0;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  for(i=0; i<pSrc->nSrc; i++){
    struct SrcList_item *pItem = &pSrc->a[i];
    if( pItem->pTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }

  return WRC_Continue;
}